

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-interface.c
# Opt level: O3

int run_test_udp_multicast_interface(void)

{
  int iVar1;
  int extraout_EAX;
  int iVar2;
  int extraout_EAX_00;
  uv_udp_t *loop;
  uv_loop_t *loop_00;
  char *pcVar3;
  sockaddr_in baddr;
  sockaddr_in addr;
  uv_udp_send_t req;
  sockaddr_in sStack_178;
  sockaddr_in local_168;
  uv_buf_t local_158;
  
  pcVar3 = "239.255.0.1";
  iVar2 = 0x23a3;
  iVar1 = uv_ip4_addr("239.255.0.1",0x23a3,&local_168);
  if (iVar1 == 0) {
    loop = (uv_udp_t *)uv_default_loop();
    iVar2 = 0x5505c0;
    iVar1 = uv_udp_init((uv_loop_t *)loop,&server);
    if (iVar1 != 0) goto LAB_00177952;
    pcVar3 = "0.0.0.0";
    iVar2 = 0;
    iVar1 = uv_ip4_addr("0.0.0.0",0,&sStack_178);
    loop = (uv_udp_t *)pcVar3;
    if (iVar1 != 0) goto LAB_00177957;
    loop = &server;
    iVar2 = (int)&sStack_178;
    iVar1 = uv_udp_bind(&server,(sockaddr *)&sStack_178,0);
    if (iVar1 != 0) goto LAB_0017795c;
    loop = &server;
    iVar2 = 0x18e334;
    iVar1 = uv_udp_set_multicast_interface(&server,"0.0.0.0");
    if (iVar1 != 0) goto LAB_00177961;
    local_158 = uv_buf_init("PING",4);
    iVar2 = 0x5505c0;
    loop = (uv_udp_t *)&stack0xfffffffffffffeb8;
    iVar1 = uv_udp_send((uv_udp_send_t *)loop,&server,&local_158,1,(sockaddr *)&local_168,sv_send_cb
                       );
    if (iVar1 != 0) goto LAB_00177966;
    if (close_cb_called != 0) goto LAB_0017796b;
    if (sv_send_cb_called != 0) goto LAB_00177970;
    loop = (uv_udp_t *)uv_default_loop();
    iVar2 = 0;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (sv_send_cb_called != 1) goto LAB_00177975;
    if (close_cb_called != 1) goto LAB_0017797a;
    if (server.send_queue_size != 0) goto LAB_0017797f;
    loop_00 = uv_default_loop();
    uv_walk(loop_00,close_walk_cb,(void *)0x0);
    iVar2 = 0;
    uv_run(loop_00,UV_RUN_DEFAULT);
    loop = (uv_udp_t *)uv_default_loop();
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_udp_multicast_interface_cold_1();
    loop = (uv_udp_t *)pcVar3;
LAB_00177952:
    run_test_udp_multicast_interface_cold_2();
LAB_00177957:
    run_test_udp_multicast_interface_cold_3();
LAB_0017795c:
    run_test_udp_multicast_interface_cold_4();
LAB_00177961:
    run_test_udp_multicast_interface_cold_5();
LAB_00177966:
    run_test_udp_multicast_interface_cold_6();
LAB_0017796b:
    run_test_udp_multicast_interface_cold_7();
LAB_00177970:
    run_test_udp_multicast_interface_cold_8();
LAB_00177975:
    run_test_udp_multicast_interface_cold_9();
LAB_0017797a:
    run_test_udp_multicast_interface_cold_10();
LAB_0017797f:
    run_test_udp_multicast_interface_cold_11();
  }
  run_test_udp_multicast_interface_cold_12();
  if ((uv_loop_t *)loop == (uv_loop_t *)0x0) {
    sv_send_cb_cold_3();
  }
  else {
    if ((1 < iVar2 + 1U) && (iVar2 != -0x65)) goto LAB_001779db;
    loop = *(uv_udp_t **)&((uv_loop_t *)loop)->backend_fd;
    if (loop == &client || loop == &server) {
      sv_send_cb_called = sv_send_cb_called + 1;
      uv_close((uv_handle_t *)loop,close_cb);
      return extraout_EAX;
    }
  }
  sv_send_cb_cold_1();
LAB_001779db:
  sv_send_cb_cold_2();
  if (loop == &client || loop == &server) {
    close_cb_called = close_cb_called + 1;
    return (int)CONCAT71(0x5505,loop == &server);
  }
  close_cb_cold_1();
  iVar2 = uv_is_closing((uv_handle_t *)loop);
  if (iVar2 != 0) {
    return iVar2;
  }
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(udp_multicast_interface) {
  int r;
  uv_udp_send_t req;
  uv_buf_t buf;
  struct sockaddr_in addr;
  struct sockaddr_in baddr;

  ASSERT(0 == uv_ip4_addr("239.255.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("0.0.0.0", 0, &baddr));
  r = uv_udp_bind(&server, (const struct sockaddr*)&baddr, 0);
  ASSERT(r == 0);

  r = uv_udp_set_multicast_interface(&server, "0.0.0.0");
  ASSERT(r == 0);

  /* server sends "PING" */
  buf = uv_buf_init("PING", 4);
  r = uv_udp_send(&req,
                  &server,
                  &buf,
                  1,
                  (const struct sockaddr*)&addr,
                  sv_send_cb);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(sv_send_cb_called == 1);
  ASSERT(close_cb_called == 1);

  ASSERT(client.send_queue_size == 0);
  ASSERT(server.send_queue_size == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}